

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::Mirror(BoardView *this)

{
  undefined8 *puVar1;
  long *plVar2;
  pointer pAVar3;
  int iVar4;
  Annotation *ann;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pAVar5;
  shared_ptr<Point> *p_1;
  undefined8 *puVar6;
  long *plVar7;
  shared_ptr<Point> *p;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float local_c;
  
  iVar4 = (*this->m_board->_vptr_Board[5])();
  puVar6 = *(undefined8 **)CONCAT44(extraout_var,iVar4);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
  if (puVar6 == puVar1) {
    local_c = 1.1754944e-38;
  }
  else {
    puVar8 = puVar6;
    fVar12 = 1.1754944e-38;
    do {
      local_c = *(float *)*puVar8;
      if (*(float *)*puVar8 <= fVar12) {
        local_c = fVar12;
      }
      puVar8 = puVar8 + 2;
      fVar12 = local_c;
    } while (puVar8 != puVar1);
    for (; puVar6 != puVar1; puVar6 = puVar6 + 2) {
      *(float *)*puVar6 = local_c - *(float *)*puVar6;
    }
  }
  iVar4 = (*this->m_board->_vptr_Board[4])();
  plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1];
  for (plVar7 = *(long **)CONCAT44(extraout_var_00,iVar4); plVar7 != plVar2; plVar7 = plVar7 + 2) {
    *(float *)(*plVar7 + 0x50) = local_c - *(float *)(*plVar7 + 0x50);
  }
  iVar4 = (*this->m_board->_vptr_Board[3])();
  plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1];
  for (plVar7 = *(long **)CONCAT44(extraout_var_01,iVar4); plVar7 != plVar2; plVar7 = plVar7 + 2) {
    lVar10 = *plVar7;
    *(float *)(lVar10 + 0xd0) = local_c - *(float *)(lVar10 + 0xd0);
    if (*(char *)(lVar10 + 0xa0) == '\x01') {
      lVar9 = 0;
      do {
        *(float *)(lVar10 + 0x70 + lVar9 * 8) = local_c - *(float *)(lVar10 + 0x70 + lVar9 * 8);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    lVar9 = *(long *)(lVar10 + 0xa8);
    lVar10 = *(long *)(lVar10 + 0xb0) - lVar9;
    if (lVar10 != 0) {
      lVar10 = lVar10 >> 3;
      lVar11 = 0;
      do {
        *(float *)(lVar9 + lVar11 * 8) = local_c - *(float *)(lVar9 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
    }
  }
  pAVar5 = (this->m_annotations).annotations.
           super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar3 = (this->m_annotations).annotations.
           super__Vector_base<Annotation,_std::allocator<Annotation>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pAVar5 != pAVar3) {
    do {
      pAVar5->x = (double)local_c - pAVar5->x;
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar3);
  }
  return;
}

Assistant:

void BoardView::Mirror(void) {
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (auto &p : outline) {
		p->x = max.x - p->x;
	}

	for (auto &p : m_board->Pins()) {
		//	auto p        = pin.get();
		p->position.x = max.x - p->position.x;
	}

	for (auto &part : m_board->Components()) {

		part->centerpoint.x = max.x - part->centerpoint.x;

		if (part->outline_done) {
			for (size_t i = 0; i < part->outline.size(); i++) {
				part->outline[i].x = max.x - part->outline[i].x;
			}
		}

		for (size_t i = 0; i < part->hull.size(); i++) {
			part->hull[i].x = max.x - part->hull[i].x;
		}
	}

	for (auto &ann : m_annotations.annotations) {
		ann.x = max.x - ann.x;
	}
}